

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall cmComputeTargetDepends::DisplaySideEffects(cmComputeTargetDepends *this)

{
  mapped_type_conflict1 mVar1;
  FILE *pFVar2;
  cmComputeTargetDepends *pcVar3;
  map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
  *this_00;
  long lVar4;
  string *psVar5;
  pointer pTVar6;
  mapped_type_conflict1 *pmVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  cmGeneratorTarget *gt;
  FILE *local_50;
  cmComputeTargetDepends *local_48;
  map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
  *local_40;
  long local_38;
  
  fwrite("The side effects are:\n",0x16,1,_stderr);
  lVar4 = (long)(this->SideEffects).
                super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->SideEffects).
                super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    lVar4 = lVar4 / 0x60;
    local_40 = &this->TargetIndex;
    local_38 = lVar4 + (ulong)(lVar4 == 0);
    lVar4 = 0;
    local_48 = this;
    do {
      pcVar3 = local_48;
      pFVar2 = _stderr;
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((local_48->Targets).
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar4]);
      fprintf(pFVar2,"target %zu is [%s]\n",lVar4,(psVar5->_M_dataplus)._M_p);
      pTVar6 = (pcVar3->SideEffects).
               super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(size_t *)((long)&pTVar6[lVar4].CustomCommandSideEffects._M_t._M_impl + 0x28) != 0) {
        fwrite("  custom commands\n",0x12,1,_stderr);
        this_00 = local_40;
        pTVar6 = (pcVar3->SideEffects).
                 super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var8 = (_Rb_tree_node_base *)
                 ((long)&pTVar6[lVar4].CustomCommandSideEffects._M_t._M_impl + 8);
        p_Var9 = *(_Base_ptr *)((long)&pTVar6[lVar4].CustomCommandSideEffects._M_t._M_impl + 0x18);
        if (p_Var9 != p_Var8) {
          do {
            gt = *(cmGeneratorTarget **)(p_Var9 + 1);
            local_50 = _stderr;
            pmVar7 = std::
                     map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                     ::operator[](this_00,&gt);
            mVar1 = *pmVar7;
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
            fprintf(local_50,"    from target %zu [%s]\n",mVar1,(psVar5->_M_dataplus)._M_p);
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != p_Var8);
          pTVar6 = (local_48->SideEffects).
                   super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      local_50 = (FILE *)((long)&pTVar6[lVar4].LanguageSideEffects._M_t._M_impl + 8);
      p_Var9 = *(_Base_ptr *)((long)&pTVar6[lVar4].LanguageSideEffects._M_t._M_impl + 0x18);
      if ((FILE *)p_Var9 != local_50) {
        do {
          fprintf(_stderr,"  language %s\n",*(undefined8 *)(p_Var9 + 1));
          p_Var8 = p_Var9[2]._M_right;
          pFVar2 = _stderr;
          while (_stderr = pFVar2, p_Var8 != (_Rb_tree_node_base *)&p_Var9[2]._M_parent) {
            gt = *(cmGeneratorTarget **)(p_Var8 + 1);
            pmVar7 = std::
                     map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                     ::operator[](local_40,&gt);
            mVar1 = *pmVar7;
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
            fprintf(pFVar2,"    from target %zu [%s]\n",mVar1,(psVar5->_M_dataplus)._M_p);
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
            pFVar2 = _stderr;
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while ((FILE *)p_Var9 != local_50);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != local_38);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeTargetDepends::DisplaySideEffects()
{
  fprintf(stderr, "The side effects are:\n");
  size_t n = this->SideEffects.size();
  for (size_t depender_index = 0; depender_index < n; ++depender_index) {
    cmGeneratorTarget const* depender = this->Targets[depender_index];
    fprintf(stderr, "target %zu is [%s]\n", depender_index,
            depender->GetName().c_str());
    if (!this->SideEffects[depender_index].CustomCommandSideEffects.empty()) {
      fprintf(stderr, "  custom commands\n");
      for (auto const* gt :
           this->SideEffects[depender_index].CustomCommandSideEffects) {
        fprintf(stderr, "    from target %zu [%s]\n", this->TargetIndex[gt],
                gt->GetName().c_str());
      }
    }
    for (auto const& it :
         this->SideEffects[depender_index].LanguageSideEffects) {
      fprintf(stderr, "  language %s\n", it.first.c_str());
      for (auto const* gt : it.second) {
        fprintf(stderr, "    from target %zu [%s]\n", this->TargetIndex[gt],
                gt->GetName().c_str());
      }
    }
  }
  fprintf(stderr, "\n");
}